

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ReporterBase::listTests
          (ReporterBase *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests)

{
  ostream *out;
  int iVar1;
  Verbosity verbosity;
  ColourImpl *streamColour;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests_local;
  ReporterBase *this_local;
  
  out = this->m_stream;
  streamColour = Detail::unique_ptr<Catch::ColourImpl>::get(&this->m_colour);
  iVar1 = (*((this->super_IEventListener).m_config)->_vptr_IConfig[0xe])();
  verbosity = (*((this->super_IEventListener).m_config)->_vptr_IConfig[0x16])();
  defaultListTests(out,streamColour,tests,(bool)((byte)iVar1 & 1),verbosity);
  return;
}

Assistant:

void ReporterBase::listTests(std::vector<TestCaseHandle> const& tests) {
        defaultListTests(m_stream,
                         m_colour.get(),
                         tests,
                         m_config->hasTestFilters(),
                         m_config->verbosity());
    }